

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_queue.cpp
# Opt level: O0

void use_queue(void)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  Item *this;
  long lVar5;
  int num_queued;
  int num_leave;
  int remain_wait_time;
  int t;
  Item temp;
  double average_customer_time_spent;
  double customers_per_hour;
  long minutes;
  int hours;
  undefined1 local_28 [8];
  Queue queue;
  int qs;
  
  tVar3 = time((time_t *)0x0);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,tVar3);
  std::operator<<(poVar4,"\n");
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  std::operator<<((ostream *)&std::cout,"ICBC Teller\n");
  std::operator<<((ostream *)&std::cout,"Enter maximum size of queue:");
  std::istream::operator>>(&std::cin,&queue._max_size);
  L12_2::Queue::Queue((Queue *)local_28,queue._max_size);
  std::operator<<((ostream *)&std::cout,"Enter the number of simulation hours: ");
  std::istream::operator>>(&std::cin,(int *)&minutes);
  customers_per_hour = (double)(long)((int)minutes * 0x3c);
  std::operator<<((ostream *)&std::cout,"Enter the average number of customer per hour: ");
  std::istream::operator>>(&std::cin,&average_customer_time_spent);
  temp._8_8_ = 60.0 / average_customer_time_spent;
  L12_2::Customer::Customer((Customer *)&remain_wait_time);
  num_queued = 0;
  for (num_leave = 0; (long)num_leave < (long)customers_per_hour; num_leave = num_leave + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"====> minute=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,num_leave);
    std::operator<<(poVar4," <====\n");
    bVar1 = check_new_customer((double)temp._8_8_);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"new customer incoming!\n");
      bVar1 = L12_2::Queue::is_full((Queue *)local_28);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Current queue(size=");
        iVar2 = L12_2::Queue::get_size((Queue *)local_28);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,") is full, had to go away...\n");
      }
      else {
        L12_2::Customer::init((Customer *)&remain_wait_time,(EVP_PKEY_CTX *)(long)num_leave);
        L12_2::Queue::enqueue((Queue *)local_28,(Item *)&remain_wait_time);
        poVar4 = std::operator<<((ostream *)&std::cout,"Added to the queue(size=");
        iVar2 = L12_2::Queue::get_size((Queue *)local_28);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,")\n");
      }
    }
    bVar1 = L12_2::Queue::is_empty((Queue *)local_28);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"no customer, rest...\n");
    }
    else {
      if (num_queued == 0) {
        this = L12_2::Queue::first((Queue *)local_28);
        lVar5 = L12_2::Customer::get_process_time(this);
        num_queued = (int)lVar5;
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "now begin to handle customer. current queue(size=");
        iVar2 = L12_2::Queue::get_size((Queue *)local_28);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = std::operator<<(poVar4,"). it takes ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,num_queued);
        std::operator<<(poVar4," minutes. \n");
      }
      num_queued = num_queued + -1;
      poVar4 = std::operator<<((ostream *)&std::cout,"Time pass...");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,num_queued);
      std::operator<<(poVar4,"\n");
      if (num_queued < 1) {
        L12_2::Queue::dequeue((Queue *)local_28,(Item *)&remain_wait_time);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ok, successfully handled one customer. current queue(size=");
        iVar2 = L12_2::Queue::get_size((Queue *)local_28);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,")\n");
      }
    }
  }
  L12_2::Queue::~Queue((Queue *)local_28);
  return;
}

Assistant:

void use_queue() {
    using std::cout;
    using std::endl;
    using std::cin;
    using namespace L12_2;

    //  std::time: get current second count from 1970.1.1
    std::cout << std::time(nullptr) << "\n";

    //  以当前秒数作为伪随机种子
    std::srand(std::time(nullptr));

    cout << "ICBC Teller\n";
    cout << "Enter maximum size of queue:";
    int qs;
    cin >> qs;
    Queue queue(qs);

    cout << "Enter the number of simulation hours: ";
    int hours;
    cin >> hours;
    long minutes = hours * MINUTES_PER_HOUR;

    cout << "Enter the average number of customer per hour: ";
    double customers_per_hour;
    cin >> customers_per_hour;
    //  平均每个人耗时多少分钟
    double average_customer_time_spent = MINUTES_PER_HOUR / customers_per_hour;

    Item temp;
    int t = 0;
    //  队列中正在等待的人的剩余等待时间
    int remain_wait_time = 0;
    //  因队列满了，被赶走的人
    int num_leave = 0;
    //  总共的加入队列的顾客
    int num_queued = 0;
    for (t = 0; t < minutes; t++) {
        //  随机生成是否有新客户
        cout << "====> minute=" << t << " <====\n";
        if (check_new_customer(average_customer_time_spent)) {
            cout << "new customer incoming!\n";
            if (queue.is_full()) {
                //  队列满了，该顾客只能走了
                num_leave++;
                cout << "Current queue(size=" << queue.get_size() << ") is full, had to go away...\n";
            } else {
                num_queued++;
                temp.init(t);
                queue.enqueue(temp);
                cout << "Added to the queue(size=" << queue.get_size() << ")\n";
            }
        }
        if (queue.is_empty()) {
            cout << "no customer, rest...\n";
            continue;
        }
        //  应该开始处理队列里的第一个人
        if (remain_wait_time == 0) {
            remain_wait_time = queue.first().get_process_time();
            cout << "now begin to handle customer. current queue(size=" << queue.get_size() << "). it takes " << remain_wait_time << " minutes. \n";
        }
        //  time pass...
        remain_wait_time--;
        cout << "Time pass..." << remain_wait_time << "\n";
        //  如果队列非空，且队列中当前等待的人剩余等待时间已满，那么该 shift 了...
        if (remain_wait_time <= 0) {
            queue.dequeue(temp);
            //  设置为下一个顾客的等待时间
//            remain_wait_time = temp.get_process_time();
            cout << "ok, successfully handled one customer. current queue(size=" << queue.get_size() << ")\n";
        }
    }
}